

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,int index_in_file_messages,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  _Rb_tree_node_base *haystack;
  Options *this_00;
  FieldGeneratorMap *this_01;
  vector<int,_std::allocator<int>_> *has_bit_indices_;
  vector<int,_std::allocator<int>_> *inlined_string_indices;
  unique_ptr<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  *puVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  int iVar2;
  Descriptor *pDVar3;
  pointer ppFVar4;
  FieldDescriptor *pFVar5;
  StringPiece injector_template_suffix;
  StringPiece injector_template_suffix_00;
  StringPiece injector_template_suffix_01;
  StringPiece injector_template_suffix_02;
  StringPiece injector_template_suffix_03;
  _Alloc_hider _Var6;
  bool bVar7;
  byte bVar8;
  MessageLayoutHelper *pMVar9;
  mapped_type *pmVar10;
  size_type sVar11;
  _Base_ptr p_Var12;
  OneofDescriptor *pOVar13;
  char *pcVar14;
  ulong uVar15;
  ParseFunctionGenerator *this_03;
  MessageSCCAnalyzer *pMVar16;
  ulong uVar17;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar18;
  long lVar19;
  Options *this_04;
  AlphaNum *this_05;
  AlphaNum *c;
  pointer ppFVar20;
  long lVar21;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  StringPiece injector_template_prefix;
  StringPiece injector_template_prefix_00;
  StringPiece injector_template_prefix_01;
  StringPiece injector_template_prefix_02;
  StringPiece injector_template_prefix_03;
  AlphaNum *in_stack_fffffffffffffa18;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  accessor_annotations_to_hooks;
  value_type field;
  _Base_ptr local_548;
  AlphaNum local_520;
  string str_index;
  StringPiece local_4d0;
  StringPiece local_4c0;
  StringPiece local_4b0;
  StringPiece local_4a0;
  StringPiece local_490;
  AlphaNum local_480;
  StringPiece local_450;
  StringPiece local_440;
  StringPiece local_430;
  StringPiece local_420;
  StringPiece local_410;
  AlphaNum local_400;
  string injector_template;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_50;
  
  this->descriptor_ = descriptor;
  this->index_in_file_messages_ = index_in_file_messages;
  ClassName_abi_cxx11_(&this->classname_,(cpp *)descriptor,(Descriptor *)vars);
  this_00 = &this->options_;
  Options::Options(this_00,options);
  this_01 = &this->field_generators_;
  pMVar16 = scc_analyzer;
  FieldGeneratorMap::FieldGeneratorMap(this_01,descriptor,options,scc_analyzer);
  this_04 = (Options *)&this->optimized_order_;
  has_bit_indices_ = &this->has_bit_indices_;
  inlined_string_indices = &this->inlined_string_indices_;
  this->num_weak_fields_ = 0;
  puVar1 = &this->message_layout_helper_;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_has_bit_index_ = 0;
  (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_layout_helper_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>._M_head_impl
       = (MessageLayoutHelper *)0x0;
  (this->parse_function_generator_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>.
  _M_head_impl = (ParseFunctionGenerator *)0x0;
  this->scc_analyzer_ = scc_analyzer;
  this_02 = &this->variables_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&this_02->_M_t,&vars->_M_t);
  if ((puVar1->_M_t).
      super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
      .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
      _M_head_impl == (MessageLayoutHelper *)0x0) {
    pMVar9 = (MessageLayoutHelper *)operator_new(8);
    pMVar9->_vptr_MessageLayoutHelper = (_func_int **)&PTR__MessageLayoutHelper_004d9548;
    (puVar1->_M_t).
    super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
    .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
    _M_head_impl = pMVar9;
    pMVar16 = (MessageSCCAnalyzer *)puVar1;
  }
  std::__cxx11::string::string
            ((string *)&injector_template,"classname",(allocator *)&accessor_annotations_to_hooks);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,&injector_template);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  std::__cxx11::string::~string((string *)&injector_template);
  QualifiedClassName_abi_cxx11_
            (&injector_template,(cpp *)this->descriptor_,(Descriptor *)options,(Options *)pMVar16);
  std::__cxx11::string::string
            ((string *)&accessor_annotations_to_hooks,"classtype",(allocator *)&field);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,(key_type *)&accessor_annotations_to_hooks);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&injector_template);
  std::__cxx11::string::~string((string *)&accessor_annotations_to_hooks);
  std::__cxx11::string::~string((string *)&injector_template);
  std::__cxx11::string::string
            ((string *)&injector_template,"full_name",(allocator *)&accessor_annotations_to_hooks);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,&injector_template);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  std::__cxx11::string::~string((string *)&injector_template);
  SuperClassName_abi_cxx11_
            (&injector_template,(cpp *)this->descriptor_,(Descriptor *)this_00,(Options *)pMVar16);
  std::__cxx11::string::string
            ((string *)&accessor_annotations_to_hooks,"superclass",(allocator *)&field);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,(key_type *)&accessor_annotations_to_hooks);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&injector_template);
  std::__cxx11::string::~string((string *)&accessor_annotations_to_hooks);
  std::__cxx11::string::~string((string *)&injector_template);
  std::__cxx11::string::string
            ((string *)&injector_template,"annotate_serialize",
             (allocator *)&accessor_annotations_to_hooks);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,&injector_template);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&injector_template);
  std::__cxx11::string::string
            ((string *)&injector_template,"annotate_deserialize",
             (allocator *)&accessor_annotations_to_hooks);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,&injector_template);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&injector_template);
  std::__cxx11::string::string
            ((string *)&injector_template,"annotate_reflection",
             (allocator *)&accessor_annotations_to_hooks);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,&injector_template);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&injector_template);
  std::__cxx11::string::string
            ((string *)&injector_template,"annotate_bytesize",
             (allocator *)&accessor_annotations_to_hooks);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,&injector_template);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&injector_template);
  std::__cxx11::string::string
            ((string *)&injector_template,"annotate_mergefrom",
             (allocator *)&accessor_annotations_to_hooks);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_02,&injector_template);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&injector_template);
  if (((options->field_listener_options).inject_field_listener_events == true) &&
     (*(int *)(*(long *)(*(long *)(descriptor + 0x10) + 0x78) + 0xa0) != 3)) {
    std::__cxx11::string::string
              ((string *)&injector_template,"  _tracker_.",
               (allocator *)&accessor_annotations_to_hooks);
    stringpiece_internal::StringPiece::StringPiece(&local_490,"serialize");
    _Var6 = injector_template._M_dataplus;
    sVar11 = stringpiece_internal::StringPiece::CheckSize(injector_template._M_string_length);
    stringpiece_internal::StringPiece::StringPiece(&local_410,"OnSerialize(this);\n");
    injector_template_suffix.length_ = local_410.length_;
    injector_template_suffix.ptr_ = local_410.ptr_;
    injector_template_prefix.length_ = sVar11;
    injector_template_prefix.ptr_ = _Var6._M_p;
    anon_unknown_0::MaySetAnnotationVariable
              (options,local_490,injector_template_prefix,injector_template_suffix,this_02);
    stringpiece_internal::StringPiece::StringPiece(&local_4a0,"deserialize");
    _Var6 = injector_template._M_dataplus;
    sVar11 = stringpiece_internal::StringPiece::CheckSize(injector_template._M_string_length);
    stringpiece_internal::StringPiece::StringPiece(&local_420,"OnDeserialize(this);\n");
    injector_template_suffix_00.length_ = local_420.length_;
    injector_template_suffix_00.ptr_ = local_420.ptr_;
    injector_template_prefix_00.length_ = sVar11;
    injector_template_prefix_00.ptr_ = _Var6._M_p;
    anon_unknown_0::MaySetAnnotationVariable
              (options,local_4a0,injector_template_prefix_00,injector_template_suffix_00,this_02);
    stringpiece_internal::StringPiece::StringPiece(&local_4b0,"reflection");
    _Var6 = injector_template._M_dataplus;
    sVar11 = stringpiece_internal::StringPiece::CheckSize(injector_template._M_string_length);
    stringpiece_internal::StringPiece::StringPiece(&local_430,"OnGetMetadata();\n");
    injector_template_suffix_01.length_ = local_430.length_;
    injector_template_suffix_01.ptr_ = local_430.ptr_;
    injector_template_prefix_01.length_ = sVar11;
    injector_template_prefix_01.ptr_ = _Var6._M_p;
    anon_unknown_0::MaySetAnnotationVariable
              (options,local_4b0,injector_template_prefix_01,injector_template_suffix_01,this_02);
    stringpiece_internal::StringPiece::StringPiece(&local_4c0,"bytesize");
    _Var6 = injector_template._M_dataplus;
    sVar11 = stringpiece_internal::StringPiece::CheckSize(injector_template._M_string_length);
    stringpiece_internal::StringPiece::StringPiece(&local_440,"OnByteSize(this);\n");
    injector_template_suffix_02.length_ = local_440.length_;
    injector_template_suffix_02.ptr_ = local_440.ptr_;
    injector_template_prefix_02.length_ = sVar11;
    injector_template_prefix_02.ptr_ = _Var6._M_p;
    anon_unknown_0::MaySetAnnotationVariable
              (options,local_4c0,injector_template_prefix_02,injector_template_suffix_02,this_02);
    stringpiece_internal::StringPiece::StringPiece(&local_4d0,"mergefrom");
    _Var6 = injector_template._M_dataplus;
    sVar11 = stringpiece_internal::StringPiece::CheckSize(injector_template._M_string_length);
    stringpiece_internal::StringPiece::StringPiece(&local_450,"OnMergeFrom(this, &from);\n");
    injector_template_suffix_03.length_ = local_450.length_;
    injector_template_suffix_03.ptr_ = local_450.ptr_;
    injector_template_prefix_03.length_ = sVar11;
    injector_template_prefix_03.ptr_ = _Var6._M_p;
    anon_unknown_0::MaySetAnnotationVariable
              (options,local_4d0,injector_template_prefix_03,injector_template_suffix_03,this_02);
    std::__cxx11::string::~string((string *)&injector_template);
    in_stack_fffffffffffffa18 = (AlphaNum *)local_450.ptr_;
  }
  pDVar3 = this->descriptor_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&injector_template,(char (*) [23])"annotate_extension_has",
             (char (*) [15])"OnHasExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[25],_const_char_(&)[17],_true>
            (&local_390,(char (*) [25])"annotate_extension_clear",(char (*) [17])"OnClearExtension")
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[16],_true>
            (&local_350,(char (*) [33])"annotate_extension_repeated_size",
             (char (*) [16])"OnExtensionSize");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            (&local_310,(char (*) [23])"annotate_extension_get",(char (*) [15])"OnGetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[19],_true>
            (&local_2d0,(char (*) [27])"annotate_extension_mutable",
             (char (*) [19])"OnMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            (&local_290,(char (*) [23])"annotate_extension_set",(char (*) [15])"OnSetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[19],_true>
            (&local_250,(char (*) [27])"annotate_extension_release",
             (char (*) [19])"OnReleaseExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_210,(char (*) [32])"annotate_repeated_extension_get",
             (char (*) [15])"OnGetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[36],_const_char_(&)[19],_true>
            (&local_1d0,(char (*) [36])"annotate_repeated_extension_mutable",
             (char (*) [19])"OnMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_190,(char (*) [32])"annotate_repeated_extension_set",
             (char (*) [15])"OnSetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_150,(char (*) [32])"annotate_repeated_extension_add",
             (char (*) [15])"OnAddExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[40],_const_char_(&)[22],_true>
            (&local_110,(char (*) [40])"annotate_repeated_extension_add_mutable",
             (char (*) [22])"OnAddMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[16],_true>
            (&local_d0,(char (*) [33])"annotate_repeated_extension_list",
             (char (*) [16])"OnListExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[41],_const_char_(&)[23],_true>
            (&local_90,(char (*) [41])"annotate_repeated_extension_list_mutable",
             (char (*) [23])"OnMutableListExtension");
  c = &local_480;
  __l._M_len = 0xe;
  __l._M_array = (iterator)&injector_template;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&accessor_annotations_to_hooks,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &field,(allocator_type *)c);
  lVar19 = 0x340;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&injector_template._M_dataplus._M_p + lVar19));
    lVar19 = lVar19 + -0x40;
  } while (lVar19 != -0x40);
  for (p_Var12 = accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 !=
      &accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_02,(key_type *)(p_Var12 + 1));
    std::__cxx11::string::assign((char *)pmVar10);
  }
  if (((this->options_).field_listener_options.inject_field_listener_events != false) &&
     (*(int *)(*(long *)(*(long *)(pDVar3 + 0x10) + 0x78) + 0xa0) != 3)) {
    for (p_Var12 = accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var12 !=
        &accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      std::__cxx11::string::string((string *)&injector_template,"repeated",(allocator *)&local_520);
      haystack = p_Var12 + 1;
      bVar7 = anon_unknown_0::StrContains((string *)haystack,&injector_template);
      if (bVar7) {
LAB_002d47ce:
        std::__cxx11::string::~string((string *)&injector_template);
LAB_002d47d6:
        std::__cxx11::string::string
                  ((string *)&injector_template,"repeated",(allocator *)&local_520);
        bVar7 = anon_unknown_0::StrContains((string *)haystack,&injector_template);
        if (bVar7) {
          std::__cxx11::string::string((string *)&field,"list",(allocator *)&local_400);
          bVar7 = anon_unknown_0::StrContains((string *)haystack,(string *)&field);
          if (bVar7) {
            std::__cxx11::string::~string((string *)&field);
            goto LAB_002d4839;
          }
          std::__cxx11::string::string((string *)&local_480,"size",(allocator *)&str_index);
          bVar7 = anon_unknown_0::StrContains((string *)haystack,(string *)&local_480);
          std::__cxx11::string::~string((string *)&local_480);
          std::__cxx11::string::~string((string *)&field);
          std::__cxx11::string::~string((string *)&injector_template);
          if (bVar7) goto LAB_002d4841;
          std::__cxx11::string::string((string *)&str_index,"index",(allocator *)&injector_template)
          ;
          std::__cxx11::string::string((string *)&injector_template,"add",(allocator *)&field);
          bVar7 = anon_unknown_0::StrContains((string *)haystack,&injector_template);
          std::__cxx11::string::~string((string *)&injector_template);
          if (bVar7) {
            std::__cxx11::string::assign((char *)&str_index);
          }
          injector_template._M_dataplus._M_p = "  _tracker_.";
          injector_template._M_string_length = 0xc;
          field = *(value_type *)(p_Var12 + 2);
          local_548 = p_Var12[2]._M_parent;
          local_480.piece_data_ =
               "(this, id.number(), _proto_TypeTraits::GetPtr(id.number(), _extensions_, ";
          local_480.piece_size_ = 0x49;
          local_520.piece_data_ = str_index._M_dataplus._M_p;
          local_520.piece_size_ = str_index._M_string_length;
          local_400.piece_data_ = "));";
          local_400.piece_size_ = 3;
          c = &local_520;
          StrCat_abi_cxx11_(&local_50,(protobuf *)&injector_template,(AlphaNum *)&field,&local_480,c
                            ,&local_400,in_stack_fffffffffffffa18);
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_02,(key_type *)haystack);
          std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          this_05 = (AlphaNum *)&str_index;
          goto LAB_002d4941;
        }
LAB_002d4839:
        std::__cxx11::string::~string((string *)&injector_template);
LAB_002d4841:
        std::__cxx11::string::string((string *)&injector_template,"list",(allocator *)&local_480);
        bVar7 = anon_unknown_0::StrContains((string *)haystack,&injector_template);
        if (bVar7) {
          std::__cxx11::string::~string((string *)&injector_template);
LAB_002d48b7:
          injector_template._M_dataplus._M_p = "  _tracker_.";
          injector_template._M_string_length = 0xc;
          field = *(value_type *)(p_Var12 + 2);
          local_548 = p_Var12[2]._M_parent;
          local_480.piece_data_ =
               "(this, id.number(), _proto_TypeTraits::GetRepeatedPtr(id.number(), _extensions_));";
          local_480.piece_size_ = 0x52;
          StrCat_abi_cxx11_((string *)&local_520,(protobuf *)&injector_template,(AlphaNum *)&field,
                            &local_480,c);
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_02,(key_type *)haystack);
          goto LAB_002d492b;
        }
        std::__cxx11::string::string((string *)&field,"size",(allocator *)&local_520);
        bVar7 = anon_unknown_0::StrContains((string *)haystack,(string *)&field);
        std::__cxx11::string::~string((string *)&field);
        std::__cxx11::string::~string((string *)&injector_template);
        if (bVar7) goto LAB_002d48b7;
      }
      else {
        std::__cxx11::string::string((string *)&field,"size",(allocator *)&local_400);
        bVar7 = anon_unknown_0::StrContains((string *)haystack,(string *)&field);
        if (bVar7) {
          std::__cxx11::string::~string((string *)&field);
          goto LAB_002d47ce;
        }
        std::__cxx11::string::string((string *)&local_480,"clear",(allocator *)&str_index);
        bVar7 = anon_unknown_0::StrContains((string *)haystack,(string *)&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&field);
        std::__cxx11::string::~string((string *)&injector_template);
        if (bVar7) goto LAB_002d47d6;
        injector_template._M_dataplus._M_p = "  _tracker_.";
        injector_template._M_string_length = 0xc;
        field = *(value_type *)(p_Var12 + 2);
        local_548 = p_Var12[2]._M_parent;
        local_480.piece_data_ =
             "(this, id.number(), _proto_TypeTraits::GetPtr(id.number(), _extensions_, id.default_value_ref()));"
        ;
        local_480.piece_size_ = 0x62;
        StrCat_abi_cxx11_((string *)&local_520,(protobuf *)&injector_template,(AlphaNum *)&field,
                          &local_480,c);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_02,(key_type *)haystack);
LAB_002d492b:
        this_05 = &local_520;
        std::__cxx11::string::operator=((string *)pmVar10,(string *)this_05);
LAB_002d4941:
        std::__cxx11::string::~string((string *)this_05);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&accessor_annotations_to_hooks._M_t);
  SetUnknownFieldsVariable(this->descriptor_,this_00,this_02);
  accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       this->descriptor_;
  injector_template._M_dataplus._M_p = injector_template._M_dataplus._M_p & 0xffffffff00000000;
  accessor_annotations_to_hooks._M_t._M_impl._0_4_ =
       *(undefined4 *)
        (accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 4);
  injector_template._M_string_length =
       accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  while( true ) {
    bVar7 = operator!=((Iterator *)&injector_template,(Iterator *)&accessor_annotations_to_hooks);
    if (!bVar7) break;
    field = (value_type)
            ((long)(int)injector_template._M_dataplus._M_p * 0x48 +
            *(long *)(injector_template._M_string_length + 0x28));
    bVar7 = IsWeak(field,this_00);
    if (bVar7) {
      this->num_weak_fields_ = this->num_weak_fields_ + 1;
    }
    else {
      pOVar13 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar13 == (OneofDescriptor *)0x0) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)this_04,&field);
      }
    }
    injector_template._M_dataplus._M_p._0_4_ = (int)injector_template._M_dataplus._M_p + 1;
  }
  pMVar9 = (this->message_layout_helper_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
           _M_head_impl;
  (*pMVar9->_vptr_MessageLayoutHelper[2])(pMVar9,this_04,this_00,this->scc_analyzer_);
  ppFVar4 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar20 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar20 != ppFVar4;
      ppFVar20 = ppFVar20 + 1) {
    pFVar5 = *ppFVar20;
    bVar7 = HasHasbit(pFVar5);
    if (bVar7) {
      iVar18 = extraout_EDX;
      if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_04 = (Options *)(long)*(int *)(this->descriptor_ + 4);
        std::vector<int,_std::allocator<int>_>::resize
                  (has_bit_indices_,(size_type)this_04,&(anonymous_namespace)::kNoHasbit);
        iVar18 = extraout_EDX_00;
      }
      iVar2 = this->max_has_bit_index_;
      this->max_has_bit_index_ = iVar2 + 1;
      pcVar14 = FieldDescriptor::index(pFVar5,(char *)this_04,iVar18);
      (has_bit_indices_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)pcVar14] = iVar2;
    }
    this_04 = this_00;
    bVar7 = IsStringInlined(pFVar5,this_00);
    if (bVar7) {
      iVar18 = extraout_EDX_01;
      if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_04 = (Options *)(long)*(int *)(this->descriptor_ + 4);
        std::vector<int,_std::allocator<int>_>::resize
                  (inlined_string_indices,(size_type)this_04,&(anonymous_namespace)::kNoHasbit);
        iVar18 = extraout_EDX_02;
      }
      iVar2 = this->max_inlined_string_index_;
      this->max_inlined_string_index_ = iVar2 + 1;
      pcVar14 = FieldDescriptor::index(pFVar5,(char *)this_04,iVar18);
      (inlined_string_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)pcVar14] = iVar2;
    }
  }
  if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FieldGeneratorMap::SetHasBitIndices(this_01,has_bit_indices_);
  }
  if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FieldGeneratorMap::SetInlinedStringIndices(this_01,inlined_string_indices);
  }
  this->num_required_fields_ = 0;
  uVar15 = 0;
  uVar17 = (ulong)*(uint *)(descriptor + 4);
  if ((int)*(uint *)(descriptor + 4) < 1) {
    uVar17 = uVar15;
  }
  iVar18 = 0;
  for (; uVar17 * 0x48 - uVar15 != 0; uVar15 = uVar15 + 0x48) {
    if ((*(byte *)(*(long *)(descriptor + 0x28) + 1 + uVar15) & 0x60) == 0x40) {
      iVar18 = iVar18 + 1;
      this->num_required_fields_ = iVar18;
    }
  }
  if ((this->options_).table_driven_parsing == true) {
    pDVar3 = this->descriptor_;
    pMVar16 = this->scc_analyzer_;
    lVar19 = -1;
    lVar21 = 0;
    do {
      lVar19 = lVar19 + 1;
      if (*(int *)(pDVar3 + 4) <= lVar19) goto LAB_002d4be3;
      bVar7 = HasHasbit((FieldDescriptor *)(*(long *)(pDVar3 + 0x28) + lVar21));
      lVar21 = lVar21 + 0x48;
    } while (!bVar7);
    injector_template._M_dataplus._M_p = injector_template._M_dataplus._M_p & 0xffffffff00000000;
    accessor_annotations_to_hooks._M_t._M_impl._0_4_ = *(undefined4 *)(pDVar3 + 4);
    iVar18 = 0;
    accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pDVar3;
    injector_template._M_string_length = (size_type)pDVar3;
    while( true ) {
      bVar7 = operator!=((Iterator *)&injector_template,(Iterator *)&accessor_annotations_to_hooks);
      if (!bVar7) break;
      pFVar5 = (FieldDescriptor *)
               (*(long *)(injector_template._M_string_length + 0x28) +
               (long)(int)injector_template._M_dataplus._M_p * 0x48);
      iVar2 = *(int *)(*(long *)(injector_template._M_string_length + 0x28) + 4 +
                      (long)(int)injector_template._M_dataplus._M_p * 0x48);
      if (iVar18 <= iVar2) {
        iVar18 = iVar2;
      }
      bVar7 = IsWeak(pFVar5,this_00);
      if (bVar7) goto LAB_002d4bbd;
      bVar7 = IsLazy(pFVar5,this_00,pMVar16);
      if (bVar7) goto LAB_002d4bbd;
      injector_template._M_dataplus._M_p._0_4_ = (int)injector_template._M_dataplus._M_p + 1;
    }
    if (0x7fff < iVar18) {
LAB_002d4bbd:
      bVar8 = false;
      goto LAB_002d4be5;
    }
    if ((double)iVar18 * 0.5 <= (double)*(int *)(pDVar3 + 4)) {
      bVar8 = *(byte *)(*(long *)(pDVar3 + 0x20) + 0x4b) ^ 1;
      goto LAB_002d4be5;
    }
  }
LAB_002d4be3:
  bVar8 = false;
LAB_002d4be5:
  this->table_driven_ = (bool)bVar8;
  this_03 = (ParseFunctionGenerator *)operator_new(0x70);
  ParseFunctionGenerator::ParseFunctionGenerator
            (this_03,this->descriptor_,this->max_has_bit_index_,has_bit_indices_,
             inlined_string_indices,this_00,this->scc_analyzer_,this_02);
  std::
  __uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  ::reset((__uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
           *)&this->parse_function_generator_,this_03);
  return;
}

Assistant:

MessageGenerator::MessageGenerator(
    const Descriptor* descriptor,
    const std::map<std::string, std::string>& vars, int index_in_file_messages,
    const Options& options, MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor),
      index_in_file_messages_(index_in_file_messages),
      classname_(ClassName(descriptor, false)),
      options_(options),
      field_generators_(descriptor, options, scc_analyzer),
      max_has_bit_index_(0),
      max_inlined_string_index_(0),
      num_weak_fields_(0),
      scc_analyzer_(scc_analyzer),
      variables_(vars) {
  if (!message_layout_helper_) {
    message_layout_helper_.reset(new PaddingOptimizer());
  }

  // Variables that apply to this class
  variables_["classname"] = classname_;
  variables_["classtype"] = QualifiedClassName(descriptor_, options);
  variables_["full_name"] = descriptor_->full_name();
  variables_["superclass"] = SuperClassName(descriptor_, options_);
  variables_["annotate_serialize"] = "";
  variables_["annotate_deserialize"] = "";
  variables_["annotate_reflection"] = "";
  variables_["annotate_bytesize"] = "";
  variables_["annotate_mergefrom"] = "";

  if (options.field_listener_options.inject_field_listener_events &&
      descriptor->file()->options().optimize_for() !=
          google::protobuf::FileOptions::LITE_RUNTIME) {
    const std::string injector_template = "  _tracker_.";

    MaySetAnnotationVariable(options, "serialize", injector_template,
                             "OnSerialize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "deserialize", injector_template,
                             "OnDeserialize(this);\n", &variables_);
    // TODO(danilak): Ideally annotate_reflection should not exist and we need
    // to annotate all reflective calls on our own, however, as this is a cause
    // for side effects, i.e. reading values dynamically, we want the users know
    // that dynamic access can happen.
    MaySetAnnotationVariable(options, "reflection", injector_template,
                             "OnGetMetadata();\n", &variables_);
    MaySetAnnotationVariable(options, "bytesize", injector_template,
                             "OnByteSize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "mergefrom", injector_template,
                             "OnMergeFrom(this, &from);\n", &variables_);
  }

  GenerateExtensionAnnotations(descriptor_, options_, &variables_);

  SetUnknownFieldsVariable(descriptor_, options_, &variables_);

  // Compute optimized field order to be used for layout and initialization
  // purposes.
  for (auto field : FieldRange(descriptor_)) {
    if (IsFieldStripped(field, options_)) {
      continue;
    }

    if (IsWeak(field, options_)) {
      num_weak_fields_++;
    } else if (!field->real_containing_oneof()) {
      optimized_order_.push_back(field);
    }
  }

  message_layout_helper_->OptimizeLayout(&optimized_order_, options_,
                                         scc_analyzer_);

  // This message has hasbits iff one or more fields need one.
  for (auto field : optimized_order_) {
    if (HasHasbit(field)) {
      if (has_bit_indices_.empty()) {
        has_bit_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      has_bit_indices_[field->index()] = max_has_bit_index_++;
    }
    if (IsStringInlined(field, options_)) {
      if (inlined_string_indices_.empty()) {
        inlined_string_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      inlined_string_indices_[field->index()] = max_inlined_string_index_++;
    }
  }

  if (!has_bit_indices_.empty()) {
    field_generators_.SetHasBitIndices(has_bit_indices_);
  }

  if (!inlined_string_indices_.empty()) {
    field_generators_.SetInlinedStringIndices(inlined_string_indices_);
  }

  num_required_fields_ = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      ++num_required_fields_;
    }
  }

  table_driven_ =
      TableDrivenParsingEnabled(descriptor_, options_, scc_analyzer_);
  parse_function_generator_.reset(new ParseFunctionGenerator(
      descriptor_, max_has_bit_index_, has_bit_indices_,
      inlined_string_indices_, options_, scc_analyzer_, variables_));
}